

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void __thiscall Json::StyledWriter::~StyledWriter(StyledWriter *this)

{
  (this->super_Writer)._vptr_Writer = (_func_int **)&PTR__StyledWriter_001f2ac8;
  std::__cxx11::string::~string((string *)&this->indentString_);
  std::__cxx11::string::~string((string *)&this->document_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->childValues_);
  return;
}

Assistant:

~StyledWriter() JSONCPP_OVERRIDE {}